

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_linux.cc
# Opt level: O3

void __thiscall rcdiscover::SocketLinux::bindToDevice(SocketLinux *this,string *device)

{
  int iVar1;
  int *piVar2;
  OperationNotPermitted *this_00;
  SocketException *this_01;
  long *plVar3;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  iVar1 = setsockopt(this->sock_,1,0x19,(device->_M_dataplus)._M_p,
                     (socklen_t)device->_M_string_length);
  if (iVar1 != -1) {
    return;
  }
  piVar2 = __errno_location();
  if (*piVar2 == 1) {
    this_00 = (OperationNotPermitted *)__cxa_allocate_exception(0x10);
    OperationNotPermitted::OperationNotPermitted(this_00);
    __cxa_throw(this_00,&OperationNotPermitted::typeinfo,std::runtime_error::~runtime_error);
  }
  this_01 = (SocketException *)__cxa_allocate_exception(0x38);
  std::operator+(&local_60,"Error while binding to device \"",device);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_60);
  local_40._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_40._M_dataplus._M_p == psVar4) {
    local_40.field_2._M_allocated_capacity = *psVar4;
    local_40.field_2._8_8_ = plVar3[3];
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  }
  else {
    local_40.field_2._M_allocated_capacity = *psVar4;
  }
  local_40._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  SocketException::SocketException(this_01,&local_40,*piVar2);
  __cxa_throw(this_01,&SocketException::typeinfo,SocketException::~SocketException);
}

Assistant:

void SocketLinux::bindToDevice(const std::string &device)
{
  if (::setsockopt(sock_,
                   SOL_SOCKET,
                   SO_BINDTODEVICE,
                   device.c_str(),
                   static_cast<socklen_t>(device.size())) == -1)
  {
    if (errno == 1)
    {
      throw OperationNotPermitted();
    }

    throw SocketException("Error while binding to device \"" + device + "\"",
                          errno);
  }
}